

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::update(Group *this,uint64_t planned_time)

{
  Controller *this_00;
  lock_guard<std::mutex> lVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  uint32_t uVar6;
  _Mem *p_Var7;
  Group *pGVar8;
  size_type sVar9;
  long lVar10;
  reference ppOVar11;
  pointer pvVar12;
  mutex_type *pmVar13;
  P *this_01;
  reference ppCVar14;
  Code *pCVar15;
  TimeJob *pTVar16;
  View *pVVar17;
  uint64_t uVar18;
  UpdateJob *this_02;
  uint16_t index;
  uint16_t index_00;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  P<r_exec::TimeJob> local_e8;
  P<r_exec::TimeJob> j_1;
  P<r_exec::TimeJob> j;
  Controller *new_controller;
  iterator __end2;
  iterator __begin2;
  vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_> *__range2;
  _Base_ptr local_b0;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_a8;
  const_iterator v;
  double res;
  uint64_t ijt;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_88;
  const_iterator end;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_78;
  const_iterator v_1;
  undefined1 local_68 [7];
  uint8_t selector;
  GroupState state;
  Operation *pending_operation;
  iterator __end1;
  iterator __begin1;
  vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_> *__range1;
  uint64_t now;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  uint64_t planned_time_local;
  Group *this_local;
  
  guard._M_device = (mutex_type *)planned_time;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  p_Var7 = _Mem::Get();
  pGVar8 = (Group *)_Mem::get_root(p_Var7);
  if ((this == pGVar8) ||
     (sVar9 = std::
              unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
              ::size(&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                      super_LObject.super_Code.views), sVar9 != 0)) {
    lVar10 = (*Now)();
    std::
    multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>::
    clear(&this->newly_salient_views);
    __end1 = std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>::
             begin(&this->pending_operations);
    pending_operation =
         (Operation *)
         std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>::end
                   (&this->pending_operations);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<r_exec::Group::Operation_**,_std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>_>
                                       *)&pending_operation), bVar2) {
      ppOVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::Group::Operation_**,_std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>_>
                 ::operator*(&__end1);
      state._8_8_ = *ppOVar11;
      (*((Operation *)state._8_8_)->_vptr_Operation[2])(state._8_8_,this);
      if (state._8_8_ != 0) {
        (**(code **)(*(long *)state._8_8_ + 8))();
      }
      __gnu_cxx::
      __normal_iterator<r_exec::Group::Operation_**,_std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>_>
      ::operator++(&__end1);
    }
    std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>::clear
              (&this->pending_operations);
    update_sln_thr(this);
    update_act_thr(this);
    update_vis_thr(this);
    fVar19 = get_sln_thr(this);
    fVar20 = get_c_act(this);
    fVar21 = get_c_act_thr(this);
    dVar26 = update_c_act(this);
    fVar22 = get_c_act_thr(this);
    fVar23 = get_c_sln(this);
    fVar24 = get_c_sln_thr(this);
    dVar27 = update_c_sln(this);
    fVar25 = get_c_sln_thr(this);
    GroupState::GroupState
              ((GroupState *)local_68,(double)fVar19,fVar21 < fVar20,(double)fVar22 < dVar26,
               fVar24 < fVar23,(double)fVar25 < dVar27);
    reset_stats(this);
    end.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
             std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::begin(&this->ipgm_views);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
    _Node_const_iterator
              (&local_78,
               (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&end);
    ijt = (uint64_t)
          std::
          unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
          ::end(&this->ipgm_views);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
    _Node_const_iterator
              (&local_88,
               (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&ijt);
    v_1.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
    _M_cur._7_1_ = 0;
    while (bVar2 = all_views_cond(this,(uint8_t *)
                                       ((long)&v_1.
                                               super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                               ._M_cur + 7),&local_78,&local_88), bVar2) {
      pvVar12 = std::__detail::
                _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                ::operator->(&local_78);
      pVVar17 = core::P<r_exec::View>::operator->(&pvVar12->second);
      pCVar15 = core::P<r_code::Code>::operator->(&(pVVar17->super_View).object);
      uVar5 = (*(pCVar15->super__Object)._vptr__Object[0xe])();
      if ((uVar5 & 1) == 0) {
        pvVar12 = std::__detail::
                  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  ::operator->(&local_78);
        pVVar17 = core::P<r_exec::View>::operator->(&pvVar12->second);
        pmVar13 = (mutex_type *)r_code::View::get_ijt(&pVVar17->super_View);
        if (pmVar13 < guard._M_device) {
          pvVar12 = std::__detail::
                    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    ::operator->(&local_78);
          pVVar17 = core::P::operator_cast_to_View_((P *)&pvVar12->second);
          v._M_node = (_Base_ptr)update_res(this,pVVar17);
          if ((double)v._M_node <= 0.0) {
            pvVar12 = std::__detail::
                      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                      ::operator->(&local_78);
            pVVar17 = core::P<r_exec::View>::operator->(&pvVar12->second);
            View::delete_from_object(pVVar17);
            delete_view(this,&local_78);
          }
          else {
            pvVar12 = std::__detail::
                      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                      ::operator->(&local_78);
            pVVar17 = core::P::operator_cast_to_View_((P *)&pvVar12->second);
            _update_saliency(this,(GroupState *)local_68,pVVar17);
            pvVar12 = std::__detail::
                      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                      ::operator->(&local_78);
            pVVar17 = core::P<r_exec::View>::operator->(&pvVar12->second);
            pCVar15 = core::P<r_code::Code>::operator->(&(pVVar17->super_View).object);
            (*(pCVar15->super__Object)._vptr__Object[4])(pCVar15,0);
            bVar3 = r_code::Atom::getDescriptor();
            if (bVar3 == 200) {
              pvVar12 = std::__detail::
                        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                        ::operator->(&local_78);
              pVVar17 = core::P::operator_cast_to_View_((P *)&pvVar12->second);
              _update_visibility(this,(GroupState *)local_68,pVVar17);
            }
            else if (bVar3 - 0xc9 < 7) {
              pvVar12 = std::__detail::
                        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                        ::operator->(&local_78);
              pVVar17 = core::P::operator_cast_to_View_((P *)&pvVar12->second);
              _update_activation(this,(GroupState *)local_68,pVVar17);
            }
            std::__detail::
            _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
            ::operator++(&local_78);
          }
        }
        else {
          std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
          ::operator++(&local_78);
        }
      }
      else {
        delete_view(this,&local_78);
      }
    }
    if ((state.former_sln_thr._3_1_ & 1) != 0) {
      cov(this);
    }
    std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_a8);
    local_b0 = (_Base_ptr)
               std::
               multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
               ::begin(&this->newly_salient_views);
    local_a8._M_node = local_b0;
    while( true ) {
      __range2 = (vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_> *)
                 std::
                 multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                 ::end(&this->newly_salient_views);
      bVar2 = std::operator!=(&local_a8,(_Self *)&__range2);
      if (!bVar2) break;
      this_01 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_a8);
      pVVar17 = core::P::operator_cast_to_View_(this_01);
      inject_reduction_jobs(this,pVVar17);
      std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_a8);
    }
    if (((state.former_sln_thr._1_1_ & 1) != 0) && ((state.former_sln_thr._3_1_ & 1) != 0)) {
      __end2 = std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>::begin
                         (&this->new_controllers);
      new_controller =
           (Controller *)
           std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>::end
                     (&this->new_controllers);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<r_exec::Controller_**,_std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>_>
                                         *)&new_controller), bVar2) {
        ppCVar14 = __gnu_cxx::
                   __normal_iterator<r_exec::Controller_**,_std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>_>
                   ::operator*(&__end2);
        this_00 = *ppCVar14;
        pCVar15 = Controller::getObject(this_00);
        (*(pCVar15->super__Object)._vptr__Object[4])(pCVar15,0);
        cVar4 = r_code::Atom::getDescriptor();
        if (cVar4 == -0x35) {
          pTVar16 = (TimeJob *)operator_new(0x28);
          pVVar17 = Controller::getView(this_00);
          pCVar15 = Controller::getObject(this_00);
          uVar18 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)pCVar15,(Code *)0x4,index_00);
          InputLessPGMSignalingJob::InputLessPGMSignalingJob
                    ((InputLessPGMSignalingJob *)pTVar16,pVVar17,lVar10 + uVar18);
          core::P<r_exec::TimeJob>::P(&local_e8,pTVar16);
          p_Var7 = _Mem::Get();
          pTVar16 = core::P::operator_cast_to_TimeJob_((P *)&local_e8);
          _Mem::pushTimeJob(p_Var7,pTVar16);
          core::P<r_exec::TimeJob>::~P(&local_e8);
        }
        else if (cVar4 == -0x34) {
          pTVar16 = (TimeJob *)operator_new(0x28);
          pVVar17 = Controller::getView(this_00);
          pCVar15 = Controller::getObject(this_00);
          uVar18 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)pCVar15,(Code *)0x4,index);
          AntiPGMSignalingJob::AntiPGMSignalingJob
                    ((AntiPGMSignalingJob *)pTVar16,pVVar17,lVar10 + uVar18);
          core::P<r_exec::TimeJob>::P(&j_1,pTVar16);
          p_Var7 = _Mem::Get();
          pTVar16 = core::P::operator_cast_to_TimeJob_((P *)&j_1);
          _Mem::pushTimeJob(p_Var7,pTVar16);
          core::P<r_exec::TimeJob>::~P(&j_1);
        }
        __gnu_cxx::
        __normal_iterator<r_exec::Controller_**,_std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>_>
        ::operator++(&__end2);
      }
      std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>::clear
                (&this->new_controllers);
    }
    update_stats(this);
    uVar6 = get_upr(this);
    if (uVar6 != 0) {
      p_Var7 = _Mem::Get();
      this_02 = (UpdateJob *)operator_new(0x28);
      lVar1 = guard;
      uVar6 = get_upr(this);
      lVar10 = r_code::Utils::GetBasePeriod();
      UpdateJob::UpdateJob
                (this_02,this,
                 (uint64_t)
                 ((long)&((lVar1._M_device)->super___mutex_base)._M_mutex + (ulong)uVar6 * lVar10));
      _Mem::pushTimeJob(p_Var7,(TimeJob *)this_02);
    }
  }
  else {
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[0xf])();
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Group::update(uint64_t planned_time)
{
    std::lock_guard<std::mutex> guard(mutex);

    if (this != _Mem::Get()->get_root() && views.size() == 0) {
        invalidate();
        return;
    }

    uint64_t now = Now();
    //if(get_secondary_group()!=NULL)
    // std::cout<<Utils::RelativeTime(Now())<<" UPR\n";
    //if(this==_Mem::Get()->get_stdin())
    // std::cout<<Utils::RelativeTime(Now())<<" ----------------------------------------------------------------\n";
    newly_salient_views.clear();

    // execute pending operations.
    for (Operation *pending_operation : pending_operations) {
        pending_operation->execute(this);
        delete pending_operation;
    }

    pending_operations.clear();
    // update group's ctrl values.
    update_sln_thr(); // applies decay on sln thr.
    update_act_thr();
    update_vis_thr();
    GroupState state(get_sln_thr(), get_c_act() > get_c_act_thr(), update_c_act() > get_c_act_thr(), get_c_sln() > get_c_sln_thr(), update_c_sln() > get_c_sln_thr());
    reset_stats();
    FOR_ALL_VIEWS_BEGIN_NO_INC(this, v)

    if (v->second->object->is_invalidated()) { // no need to update the view set.
        delete_view(v);
    } else {
        uint64_t ijt = v->second->get_ijt();

        if (ijt >= planned_time) { // in case the update happens later than planned, don't touch views that were injected after the planned update time: update next time.
            ++v;
            continue;
        }

        double res = update_res(v->second); // update resilience: decrement res by 1 in addition to the accumulated changes.

        if (res > 0) {
            _update_saliency(&state, v->second); // apply decay.

            switch (v->second->object->code(0).getDescriptor()) {
            case Atom::GROUP:
                _update_visibility(&state, v->second);
                break;

            case Atom::NULL_PROGRAM:
            case Atom::INSTANTIATED_PROGRAM:
            case Atom::INSTANTIATED_ANTI_PROGRAM:
            case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
            case Atom::INSTANTIATED_CPP_PROGRAM:
            case Atom::COMPOSITE_STATE:
            case Atom::MODEL:
                _update_activation(&state, v->second);
                break;
            }

            ++v;
        } else { // view has no resilience: delete it from the group.
            v->second->delete_from_object();
            delete_view(v);
        }
    }

    FOR_ALL_VIEWS_END

    if (state.is_c_salient) {
        cov();
    }

    // build reduction jobs.
    std::multiset<P<View>, r_code::View::Less>::const_iterator v;

    for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
        inject_reduction_jobs(*v);
    }

    if (state.is_c_active && state.is_c_salient) { // build signaling jobs for new ipgms.
        for (Controller *new_controller : new_controllers) {
            switch (new_controller->getObject()->code(0).getDescriptor()) {
            case Atom::INSTANTIATED_ANTI_PROGRAM: { // inject signaling jobs for |ipgm (tsc).
                P<TimeJob> j = new AntiPGMSignalingJob(new_controller->getView(), now + Utils::GetTimestamp<Code>(new_controller->getObject(), IPGM_TSC));
                _Mem::Get()->pushTimeJob(j);
                break;
            }

            case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: { // inject a signaling job for an input-less pgm.
                P<TimeJob> j = new InputLessPGMSignalingJob(new_controller->getView(), now + Utils::GetTimestamp<Code>(new_controller->getObject(), IPGM_TSC));
                _Mem::Get()->pushTimeJob(j);
                break;
            }
            }
        }

        new_controllers.clear();
    }

    update_stats(); // triggers notifications.

    if (get_upr() > 0) { // inject the next update job for the group.
        _Mem::Get()->pushTimeJob(new UpdateJob(this, planned_time + get_upr()*Utils::GetBasePeriod()));
    }

    //if(get_secondary_group()!=NULL)
    //if(this==_Mem::Get()->get_stdin())
    // std::cout<<Utils::RelativeTime(Now())<<" ++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
}